

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall cs222::Parser::parseOperation(Parser *this,string *token,string *operation)

{
  bool bVar1;
  undefined8 extraout_RAX;
  allocator local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = isDirective(token);
  if (!bVar1) {
    bVar1 = isOperation(token);
    if (!bVar1) {
      if (*(token->_M_dataplus)._M_p == '+') {
        std::__cxx11::string::substr((ulong)&local_68,(ulong)token);
        bVar1 = isOperation(&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)operation);
          std::bitset<6UL>::set(&this->flags,0,true);
          return;
        }
      }
      std::__cxx11::string::string
                ((string *)&local_48,"not a valid directive or operation: ",&local_69);
      std::operator+(&local_68,&local_48,token);
      throwError(this,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
      _Unwind_Resume(extraout_RAX);
    }
  }
  std::__cxx11::string::_M_assign((string *)operation);
  return;
}

Assistant:

void Parser::parseOperation(
            const std::string& token, std::string& operation)
    {
        if (isDirective(token) || isOperation(token))
        {
            operation = token;
        }
        else if (token[0] == '+' && isOperation(token.substr(1)))
        {
            operation = token;
            flags.set(Instruction::FLAG_EXTENDED);
        }
        else
        {
            throwError(std::string("not a valid directive or operation: ") + token);
        }
    }